

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

bool __thiscall
despot::util::tinyxml::TiXmlPrinter::VisitExit(TiXmlPrinter *this,TiXmlElement *element)

{
  TiXmlString *this_00;
  Rep *pRVar1;
  size_t len;
  char *__s;
  
  this->depth = this->depth + -1;
  if ((element->super_TiXmlNode).firstChild != (TiXmlNode *)0x0) {
    if (this->simpleTextPrint == true) {
      this->simpleTextPrint = false;
    }
    else {
      DoIndent(this);
    }
    this_00 = &this->buffer;
    TiXmlString::append(this_00,"</",2);
    __s = ((element->super_TiXmlNode).value.rep_)->str;
    len = strlen(__s);
    TiXmlString::append(this_00,__s,len);
    TiXmlString::append(this_00,">",1);
    pRVar1 = (this->lineBreak).rep_;
    TiXmlString::append(this_00,pRVar1->str,pRVar1->size);
  }
  return true;
}

Assistant:

bool TiXmlPrinter::VisitExit(const TiXmlElement& element) {
	--depth;
	if (!element.FirstChild()) {
		// nothing.
	} else {
		if (simpleTextPrint) {
			simpleTextPrint = false;
		} else {
			DoIndent();
		}
		buffer += "</";
		buffer += element.Value();
		buffer += ">";
		DoLineBreak();
	}
	return true;
}